

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O2

int compare_components(component_t *u1,component_t *u2)

{
  byte bVar1;
  byte *__s1;
  byte *pbVar2;
  byte *__s2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  size_t __n;
  byte bVar8;
  byte bVar9;
  
  uVar4 = 0xffffffff;
  if (u1->metaorder < u2->metaorder) {
    return uVar4;
  }
  if (u2->metaorder < u1->metaorder) {
    return 1;
  }
  __s1 = (byte *)u1->start;
  pbVar2 = (byte *)u1->end;
  __s2 = (byte *)u2->start;
  pbVar3 = (byte *)u2->end;
  uVar5 = (__s1 == pbVar2 && __s2 == pbVar3) - 1;
  if (__s1 != pbVar2) {
    uVar5 = 1;
  }
  if (__s1 == pbVar2 || __s2 == pbVar3) {
    return uVar5;
  }
  bVar7 = *__s1;
  bVar9 = (bVar7 & 0xdf) + 0xbf;
  bVar1 = *__s2;
  bVar8 = (bVar1 & 0xdf) + 0xbf;
  if ((bVar9 < 0x1a) && (bVar8 < 0x1a)) {
    bVar8 = bVar7 | 0x20;
    if (0x19 < (byte)(bVar7 + 0xbf)) {
      bVar8 = bVar7;
    }
    bVar7 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar7 = bVar1;
    }
    uVar5 = uVar4;
    if ((char)bVar7 <= (char)bVar8) {
      uVar5 = (uint)((char)bVar7 < (char)bVar8);
    }
  }
  else {
    uVar5 = -(uint)(bVar9 < 0x1a) | 1;
    if ((0x19 < bVar9) && (0x19 < bVar8)) {
      __n = (long)pbVar2 - (long)__s1;
      uVar5 = uVar4;
      if (((long)pbVar3 - (long)__s2 <= (long)__n) &&
         (uVar5 = 1, (long)__n <= (long)pbVar3 - (long)__s2)) {
        iVar6 = memcmp(__s1,__s2,__n);
        uVar5 = 0xffffffff;
        if (-1 < iVar6) {
          uVar5 = (uint)(iVar6 != 0);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int compare_components(const component_t* u1, const component_t* u2) {
	/* metaorder has highest priority */
	if (u1->metaorder < u2->metaorder) {
		return -1;
	}
	if (u1->metaorder > u2->metaorder) {
		return 1;
	}

	/* empty strings come before everything */
	int u1_is_empty = u1->start == u1->end;
	int u2_is_empty = u2->start == u2->end;

	if (u1_is_empty && u2_is_empty) {
		return 0;
	}
	if (u1_is_empty) {
		return -1;
	}
	if (u2_is_empty) {
		return 1;
	}

	/* alpha come before numbers  */
	int u1_is_alpha = my_isalpha(*u1->start);
	int u2_is_alpha = my_isalpha(*u2->start);

	if (u1_is_alpha && u2_is_alpha) {
		if (my_tolower(*u1->start) < my_tolower(*u2->start)) {
			return -1;
		}
		if (my_tolower(*u1->start) > my_tolower(*u2->start)) {
			return 1;
		}
		return 0;
	}
	if (u1_is_alpha) {
		return -1;
	}
	if (u2_is_alpha) {
		return 1;
	}

	/* numeric comparison (note that leading zeroes are already trimmed here) */
	if (u1->end - u1->start < u2->end - u2->start) {
		return -1;
	}
	if (u1->end - u1->start > u2->end - u2->start) {
		return 1;
	}

	int res = memcmp(u1->start, u2->start, u1->end - u1->start);
	if (res < 0) {
		return -1;
	}
	if (res > 0) {
		return 1;
	}
	return 0;
}